

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  intptr_t iVar7;
  test *ptVar8;
  FILE *__stream;
  int *piVar9;
  char *pcVar10;
  FILE *__stream_00;
  size_t __n;
  size_t sVar11;
  char *pcVar12;
  char **ppcVar13;
  char *file;
  size_t i_3;
  size_t rn;
  size_t r1;
  undefined1 local_2108 [7];
  _Bool compare_ok;
  char bufn [4096];
  char buf1 [4096];
  FILE *nextfp;
  char *nextfile;
  size_t i_2;
  FILE *firstfp;
  char *firstfile;
  test *test;
  ulong uStack_c8;
  _Bool keep_these_outfiles;
  size_t i_1;
  size_t npass;
  size_t nrun;
  ulong uStack_a8;
  _Bool is_dry_run;
  size_t i;
  _Bool found_one;
  char *p;
  char local_88 [6];
  _Bool test_names_given;
  _Bool keep_outfiles;
  uint8_t tests_to_run [91];
  char *pname;
  char **ppcStack_18;
  _Bool doing_opts;
  char **argv_local;
  int argc_local;
  
  bVar2 = true;
  unique0x00012000 = *argv;
  bVar1 = false;
  bVar3 = false;
  memset(local_88,1,0x5b);
  random_hash = ssh_hash_new(&ssh_sha256);
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  while (iVar5 = (int)argv_local + -1, 0 < iVar5) {
    ppcVar13 = ppcStack_18 + 1;
    pcVar12 = ppcStack_18[1];
    if ((*pcVar12 == '-') && (bVar2)) {
      iVar6 = strcmp(pcVar12,"-O");
      if (iVar6 == 0) {
        if ((int)argv_local + -2 < 1) {
          fprintf(_stderr,"\'-O\' expects a directory name\n");
          return 1;
        }
        outdir = ppcStack_18[2];
        ppcStack_18 = ppcStack_18 + 2;
        argv_local._0_4_ = (int)argv_local + -2;
      }
      else {
        iVar6 = strcmp(pcVar12,"-k");
        if ((iVar6 == 0) || (iVar6 = strcmp(pcVar12,"--keep"), iVar6 == 0)) {
          bVar1 = true;
          ppcStack_18 = ppcVar13;
          argv_local._0_4_ = iVar5;
        }
        else {
          iVar6 = strcmp(pcVar12,"--");
          if (iVar6 != 0) {
            iVar5 = strcmp(pcVar12,"--help");
            if (iVar5 == 0) {
              printf("  usage: drrun -c test/sclog/libsclog.so -- %s -O <outdir>\n",
                     stack0xffffffffffffffd8);
              printf("options: -O <outdir>           put log files in the specified directory\n");
              printf(
                    "         -k, --keep            do not delete log files for tests that passed\n"
                    );
              printf("   also: --help                display this text\n");
              return 0;
            }
            fprintf(_stderr,"unknown command line option \'%s\'\n",pcVar12);
            return 1;
          }
          bVar2 = false;
          ppcStack_18 = ppcVar13;
          argv_local._0_4_ = iVar5;
        }
      }
    }
    else {
      if (!bVar3) {
        bVar3 = true;
        memset(local_88,0,0x5b);
      }
      bVar4 = false;
      for (uStack_a8 = 0; uStack_a8 < 0x5b; uStack_a8 = uStack_a8 + 1) {
        iVar6 = wc_match(pcVar12,tests[uStack_a8].testname);
        if (iVar6 != 0) {
          local_88[uStack_a8] = '\x01';
          bVar4 = true;
        }
      }
      ppcStack_18 = ppcVar13;
      argv_local._0_4_ = iVar5;
      if (!bVar4) {
        fprintf(_stderr,"no test name matched \'%s\'\n",pcVar12);
        return 1;
      }
    }
  }
  iVar7 = (*dry_run)();
  if (iVar7 == 0) {
    printf("Live run, main = %p\n",main);
    if (outdir == (char *)0x0) {
      fprintf(_stderr,"expected -O <outdir> option\n");
      return 1;
    }
    printf("Will write log files to %s\n",outdir);
  }
  else {
    printf("Dry run (DynamoRIO instrumentation not detected)\n");
  }
  npass = 0;
  i_1 = 0;
  uStack_c8 = 0;
  do {
    if (0x5a < uStack_c8) {
      ssh_hash_free(random_hash);
      if (i_1 == npass) {
        printf("All tests passed\n");
        return 0;
      }
      printf("%zu tests failed\n",npass - i_1);
      return 1;
    }
    bVar2 = true;
    if (local_88[uStack_c8] != '\0') {
      ptVar8 = tests + uStack_c8;
      printf("Running test %s ... ",ptVar8->testname);
      fflush(_stdout);
      test_skipped = false;
      random_seed(ptVar8->testname);
      test_basename = ptVar8->testname;
      test_index = 0;
      (*tests[uStack_c8].testfn)();
      if ((test_skipped & 1U) == 0) {
        npass = npass + 1;
        if (iVar7 == 0) {
          if (test_index < 2) {
            printf("FAIL: test did not generate multiple output files\n");
          }
          else {
            pcVar12 = log_filename(test_basename,0);
            __stream = fopen(pcVar12,"rb");
            if (__stream == (FILE *)0x0) {
              piVar9 = __errno_location();
              pcVar10 = strerror(*piVar9);
              printf("ERR: %s: open: %s\n",pcVar12,pcVar10);
            }
            else {
              for (nextfile = (char *)0x1; nextfile < test_index; nextfile = nextfile + 1) {
                pcVar10 = log_filename(test_basename,(size_t)nextfile);
                __stream_00 = fopen(pcVar10,"rb");
                if (__stream_00 == (FILE *)0x0) {
                  piVar9 = __errno_location();
                  pcVar12 = strerror(*piVar9);
                  printf("ERR: %s: open: %s\n",pcVar10,pcVar12);
                  goto LAB_00106da9;
                }
                rewind(__stream);
                bVar3 = false;
                do {
                  __n = fread(bufn + 0xff8,1,0x1000,__stream);
                  sVar11 = fread(local_2108,1,0x1000,__stream_00);
                  if (__n != sVar11) {
                    printf("FAIL: %s %s: different lengths\n",pcVar12,pcVar10);
                    goto LAB_00106d27;
                  }
                  if (__n == 0) {
                    iVar5 = feof(__stream);
                    if ((iVar5 == 0) || (iVar5 = feof(__stream_00), iVar5 == 0)) {
                      printf("FAIL: %s %s: error at end of file\n",pcVar12,pcVar10);
                    }
                    else {
                      bVar3 = true;
                    }
                    goto LAB_00106d27;
                  }
                  iVar5 = memcmp(bufn + 0xff8,local_2108,__n);
                } while (iVar5 == 0);
                printf("FAIL: %s %s: different content\n",pcVar12,pcVar10);
LAB_00106d27:
                fclose(__stream_00);
                safefree(pcVar10);
                if (!bVar3) goto LAB_00106da9;
              }
              fclose(__stream);
              safefree(pcVar12);
              printf("pass\n");
              i_1 = i_1 + 1;
              bVar2 = bVar1;
            }
          }
LAB_00106da9:
          if (!bVar2) {
            for (file = (char *)0x0; file < test_index; file = file + 1) {
              pcVar12 = log_filename(test_basename,(size_t)file);
              remove(pcVar12);
              safefree(pcVar12);
            }
          }
        }
        else {
          printf("dry run done\n");
        }
      }
      else {
        printf("skipped\n");
      }
    }
    uStack_c8 = uStack_c8 + 1;
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
    bool doing_opts = true;
    const char *pname = argv[0];
    uint8_t tests_to_run[lenof(tests)];
    bool keep_outfiles = false;
    bool test_names_given = false;

    memset(tests_to_run, 1, sizeof(tests_to_run));
    random_hash = ssh_hash_new(&ssh_sha256);

    while (--argc > 0) {
        char *p = *++argv;

        if (p[0] == '-' && doing_opts) {
            if (!strcmp(p, "-O")) {
                if (--argc <= 0) {
                    fprintf(stderr, "'-O' expects a directory name\n");
                    return 1;
                }
                outdir = *++argv;
            } else if (!strcmp(p, "-k") || !strcmp(p, "--keep")) {
                keep_outfiles = true;
            } else if (!strcmp(p, "--")) {
                doing_opts = false;
            } else if (!strcmp(p, "--help")) {
                printf("  usage: drrun -c test/sclog/libsclog.so -- "
                       "%s -O <outdir>\n", pname);
                printf("options: -O <outdir>           "
                       "put log files in the specified directory\n");
                printf("         -k, --keep            "
                       "do not delete log files for tests that passed\n");
                printf("   also: --help                "
                       "display this text\n");
                return 0;
            } else {
                fprintf(stderr, "unknown command line option '%s'\n", p);
                return 1;
            }
        } else {
            if (!test_names_given) {
                test_names_given = true;
                memset(tests_to_run, 0, sizeof(tests_to_run));
            }
            bool found_one = false;
            for (size_t i = 0; i < lenof(tests); i++) {
                if (wc_match(p, tests[i].testname)) {
                    tests_to_run[i] = 1;
                    found_one = true;
                }
            }
            if (!found_one) {
                fprintf(stderr, "no test name matched '%s'\n", p);
                return 1;
            }
        }
    }

    bool is_dry_run = dry_run();

    if (is_dry_run) {
        printf("Dry run (DynamoRIO instrumentation not detected)\n");
    } else {
        /* Print the address of main() in this run. The idea is that
         * if this image is compiled to be position-independent, then
         * PC values in the logs won't match the ones you get if you
         * disassemble the binary, so it'll be harder to match up the
         * log messages to the code. But if you know the address of a
         * fixed (and not inlined) function in both worlds, you can
         * find out the offset between them. */
        printf("Live run, main = %p\n", (void *)main);

        if (!outdir) {
            fprintf(stderr, "expected -O <outdir> option\n");
            return 1;
        }
        printf("Will write log files to %s\n", outdir);
    }

    size_t nrun = 0, npass = 0;

    for (size_t i = 0; i < lenof(tests); i++) {
        bool keep_these_outfiles = true;

        if (!tests_to_run[i])
            continue;
        const struct test *test = &tests[i];
        printf("Running test %s ... ", test->testname);
        fflush(stdout);

        test_skipped = false;
        random_seed(test->testname);
        test_basename = test->testname;
        test_index = 0;

        test->testfn();

        if (test_skipped) {
            /* Used for e.g. tests of hardware-accelerated crypto when
             * the hardware acceleration isn't available */
            printf("skipped\n");
            continue;
        }

        nrun++;

        if (is_dry_run) {
            printf("dry run done\n");
            continue;                  /* test files won't exist anyway */
        }

        if (test_index < 2) {
            printf("FAIL: test did not generate multiple output files\n");
            goto test_done;
        }

        char *firstfile = log_filename(test_basename, 0);
        FILE *firstfp = fopen(firstfile, "rb");
        if (!firstfp) {
            printf("ERR: %s: open: %s\n", firstfile, strerror(errno));
            goto test_done;
        }
        for (size_t i = 1; i < test_index; i++) {
            char *nextfile = log_filename(test_basename, i);
            FILE *nextfp = fopen(nextfile, "rb");
            if (!nextfp) {
                printf("ERR: %s: open: %s\n", nextfile, strerror(errno));
                goto test_done;
            }

            rewind(firstfp);
            char buf1[4096], bufn[4096];
            bool compare_ok = false;
            while (true) {
                size_t r1 = fread(buf1, 1, sizeof(buf1), firstfp);
                size_t rn = fread(bufn, 1, sizeof(bufn), nextfp);
                if (r1 != rn) {
                    printf("FAIL: %s %s: different lengths\n",
                           firstfile, nextfile);
                    break;
                }
                if (r1 == 0) {
                    if (feof(firstfp) && feof(nextfp)) {
                        compare_ok = true;
                    } else {
                        printf("FAIL: %s %s: error at end of file\n",
                               firstfile, nextfile);
                    }
                    break;
                }
                if (memcmp(buf1, bufn, r1) != 0) {
                    printf("FAIL: %s %s: different content\n",
                           firstfile, nextfile);
                    break;
                }
            }
            fclose(nextfp);
            sfree(nextfile);
            if (!compare_ok) {
                goto test_done;
            }
        }
        fclose(firstfp);
        sfree(firstfile);

        printf("pass\n");
        npass++;
        keep_these_outfiles = keep_outfiles;

      test_done:
        if (!keep_these_outfiles) {
            for (size_t i = 0; i < test_index; i++) {
                char *file = log_filename(test_basename, i);
                remove(file);
                sfree(file);
            }
        }
    }

    ssh_hash_free(random_hash);

    if (npass == nrun) {
        printf("All tests passed\n");
        return 0;
    } else {
        printf("%"SIZEu" tests failed\n", nrun - npass);
        return 1;
    }
}